

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_internal.c
# Opt level: O1

int mbedtls_rsa_validate_params
              (mbedtls_mpi *N,mbedtls_mpi *P,mbedtls_mpi *Q,mbedtls_mpi *D,mbedtls_mpi *E,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mbedtls_mpi K;
  mbedtls_mpi L;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_48);
  if (P != (mbedtls_mpi *)0x0 && f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    iVar1 = mbedtls_mpi_is_prime(P,f_rng,p_rng);
    iVar2 = -0x4200;
    if (iVar1 != 0) goto LAB_0011dd7d;
  }
  if (Q != (mbedtls_mpi *)0x0 && f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    iVar1 = mbedtls_mpi_is_prime(Q,f_rng,p_rng);
    iVar2 = -0x4200;
    if (iVar1 != 0) goto LAB_0011dd7d;
  }
  if (N != (mbedtls_mpi *)0x0 && (P != (mbedtls_mpi *)0x0 && Q != (mbedtls_mpi *)0x0)) {
    iVar2 = mbedtls_mpi_mul_mpi(&local_60,P,Q);
    if (iVar2 != 0) goto LAB_0011dd7d;
    iVar1 = mbedtls_mpi_cmp_int(N,1);
    iVar2 = -0x4200;
    if ((iVar1 < 1) || (iVar1 = mbedtls_mpi_cmp_mpi(&local_60,N), iVar1 != 0)) goto LAB_0011dd7d;
  }
  if (E != (mbedtls_mpi *)0x0 && (D != (mbedtls_mpi *)0x0 && N != (mbedtls_mpi *)0x0)) {
    iVar1 = mbedtls_mpi_cmp_int(D,1);
    iVar2 = -0x4200;
    if ((((iVar1 < 1) || (iVar1 = mbedtls_mpi_cmp_int(E,1), iVar1 < 1)) ||
        (iVar1 = mbedtls_mpi_cmp_mpi(D,N), -1 < iVar1)) ||
       (iVar1 = mbedtls_mpi_cmp_mpi(E,N), -1 < iVar1)) goto LAB_0011dd7d;
  }
  iVar2 = 0;
  if ((P != (mbedtls_mpi *)0x0 && Q != (mbedtls_mpi *)0x0) &&
      (D != (mbedtls_mpi *)0x0 && E != (mbedtls_mpi *)0x0)) {
    iVar1 = mbedtls_mpi_cmp_int(P,1);
    iVar3 = -0x4200;
    iVar2 = iVar3;
    if ((((0 < iVar1) && (iVar1 = mbedtls_mpi_cmp_int(Q,1), 0 < iVar1)) &&
        ((iVar2 = mbedtls_mpi_mul_mpi(&local_60,D,E), iVar2 == 0 &&
         ((iVar2 = mbedtls_mpi_sub_int(&local_60,&local_60,1), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_sub_int(&local_48,P,1), iVar2 == 0)))))) &&
       ((iVar2 = mbedtls_mpi_mod_mpi(&local_60,&local_60,&local_48), iVar2 == 0 &&
        ((((iVar1 = mbedtls_mpi_cmp_int(&local_60,0), iVar2 = iVar3, iVar1 == 0 &&
           (iVar2 = mbedtls_mpi_mul_mpi(&local_60,D,E), iVar2 == 0)) &&
          (iVar2 = mbedtls_mpi_sub_int(&local_60,&local_60,1), iVar2 == 0)) &&
         ((iVar2 = mbedtls_mpi_sub_int(&local_48,Q,1), iVar2 == 0 &&
          (iVar2 = mbedtls_mpi_mod_mpi(&local_60,&local_60,&local_48), iVar2 == 0)))))))) {
      iVar1 = mbedtls_mpi_cmp_int(&local_60,0);
      iVar2 = -0x4200;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
    }
  }
LAB_0011dd7d:
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_48);
  if ((iVar2 != -0x4200) && (iVar2 != 0)) {
    iVar2 = iVar2 + -0x4200;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_validate_params( const mbedtls_mpi *N, const mbedtls_mpi *P,
                                 const mbedtls_mpi *Q, const mbedtls_mpi *D,
                                 const mbedtls_mpi *E,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng )
{
    int ret = 0;
    mbedtls_mpi K, L;

    mbedtls_mpi_init( &K );
    mbedtls_mpi_init( &L );

    /*
     * Step 1: If PRNG provided, check that P and Q are prime
     */

#if defined(MBEDTLS_GENPRIME)
    if( f_rng != NULL && P != NULL &&
        ( ret = mbedtls_mpi_is_prime( P, f_rng, p_rng ) ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
        goto cleanup;
    }

    if( f_rng != NULL && Q != NULL &&
        ( ret = mbedtls_mpi_is_prime( Q, f_rng, p_rng ) ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
        goto cleanup;
    }
#else
    ((void) f_rng);
    ((void) p_rng);
#endif /* MBEDTLS_GENPRIME */

    /*
     * Step 2: Check that 1 < N = P * Q
     */

    if( P != NULL && Q != NULL && N != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, P, Q ) );
        if( mbedtls_mpi_cmp_int( N, 1 )  <= 0 ||
            mbedtls_mpi_cmp_mpi( &K, N ) != 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /*
     * Step 3: Check and 1 < D, E < N if present.
     */

    if( N != NULL && D != NULL && E != NULL )
    {
        if ( mbedtls_mpi_cmp_int( D, 1 ) <= 0 ||
             mbedtls_mpi_cmp_int( E, 1 ) <= 0 ||
             mbedtls_mpi_cmp_mpi( D, N ) >= 0 ||
             mbedtls_mpi_cmp_mpi( E, N ) >= 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

    /*
     * Step 4: Check that D, E are inverse modulo P-1 and Q-1
     */

    if( P != NULL && Q != NULL && D != NULL && E != NULL )
    {
        if( mbedtls_mpi_cmp_int( P, 1 ) <= 0 ||
            mbedtls_mpi_cmp_int( Q, 1 ) <= 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }

        /* Compute DE-1 mod P-1 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, D, E ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, &K, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &L, P, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &K, &K, &L ) );
        if( mbedtls_mpi_cmp_int( &K, 0 ) != 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }

        /* Compute DE-1 mod Q-1 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &K, D, E ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &K, &K, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &L, Q, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &K, &K, &L ) );
        if( mbedtls_mpi_cmp_int( &K, 0 ) != 0 )
        {
            ret = MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
            goto cleanup;
        }
    }

cleanup:

    mbedtls_mpi_free( &K );
    mbedtls_mpi_free( &L );

    /* Wrap MPI error codes by RSA check failure error code */
    if( ret != 0 && ret != MBEDTLS_ERR_RSA_KEY_CHECK_FAILED )
    {
        ret += MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    return( ret );
}